

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_out32(TCGContext_conflict9 *s,uint32_t v)

{
  uint32_t *puVar1;
  tcg_insn_unit *p;
  uint32_t v_local;
  TCGContext_conflict9 *s_local;
  
  puVar1 = (uint32_t *)s->code_ptr;
  *puVar1 = v;
  s->code_ptr = (tcg_insn_unit *)(puVar1 + 1);
  return;
}

Assistant:

static  QEMU_UNUSED_FUNC inline void tcg_out32(TCGContext *s, uint32_t v)
{
    if (TCG_TARGET_INSN_UNIT_SIZE == 4) {
        *s->code_ptr++ = v;
    } else {
        tcg_insn_unit *p = s->code_ptr;
        memcpy(p, &v, sizeof(v));
        s->code_ptr = p + (4 / TCG_TARGET_INSN_UNIT_SIZE);
    }
}